

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O1

Expression __thiscall dynet::GRUBuilder::add_input_impl(GRUBuilder *this,int prev,Expression *x)

{
  float fVar1;
  pointer pEVar2;
  pointer pEVar3;
  pointer pvVar4;
  undefined8 *puVar5;
  long lVar6;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *pvVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Expression EVar13;
  Expression crt;
  Expression ft;
  Expression h_tprev;
  Expression nwt;
  Expression local_138;
  undefined1 local_128 [28];
  uint local_10c;
  Expression local_108;
  Expression local_f8;
  Expression local_e8;
  Expression local_d8;
  pointer local_c0;
  Expression local_b8;
  GRUBuilder *local_a0;
  undefined1 local_98 [80];
  pointer local_48;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_40;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_38;
  
  pEVar2 = (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_10c = prev;
  local_a0 = this;
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_98,
             (ulong)this->layers,(allocator_type *)local_128);
  local_38 = &this->h;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)&this->h,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_98);
  if ((ComputationGraph *)local_98._0_8_ != (ComputationGraph *)0x0) {
    operator_delete((void *)local_98._0_8_);
  }
  local_c0 = (local_a0->h).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_128._0_16_ = *(undefined1 (*) [16])x;
  if (local_a0->layers != 0) {
    local_40 = &local_a0->h0;
    bVar11 = pEVar3 != pEVar2;
    bVar12 = -1 < (int)local_10c;
    lVar8 = 0;
    local_48 = (pointer)((ulong)local_10c * 0x18);
    lVar9 = 0;
    uVar10 = 0;
    do {
      pvVar4 = (local_a0->param_vars).
               super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_b8.pg = (ComputationGraph *)0x0;
      local_b8.i = 0;
      local_b8.graph_id = 0;
      if (bVar12 || bVar11) {
        pvVar7 = (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                 ((long)(local_48->device_mem_checkpoint).used +
                 (long)((long)&(local_38->
                               super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[-1].
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               ._M_impl + 0x10U));
        if ((int)local_10c < 0) {
          pvVar7 = local_40;
        }
        puVar5 = (undefined8 *)
                 ((long)&((pvVar7->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->pg + lVar8);
        local_b8.pg = (ComputationGraph *)*puVar5;
        local_b8._8_8_ = puVar5[1];
      }
      fVar1 = (local_a0->super_RNNBuilder).dropout_rate;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        local_128._0_16_ = (undefined1  [16])dropout((Expression *)local_128,fVar1);
      }
      local_108 = (Expression)ZEXT816(0);
      if (bVar12 || bVar11) {
        local_98._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar4->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar9) + 0x20);
        puVar5 = *(undefined8 **)
                  ((long)&(pvVar4->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data + lVar9);
        local_98._16_8_ = *puVar5;
        local_98._24_8_ = puVar5[1];
        lVar6 = *(long *)((long)&(pvVar4->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_98._48_8_ = *(undefined8 *)(lVar6 + 0x10);
        local_98._56_8_ = *(undefined8 *)(lVar6 + 0x18);
        local_98._72_4_ = local_b8.i;
        local_98._76_4_ = local_b8.graph_id;
        local_98._64_8_ = local_b8.pg;
        local_e8.i = 5;
        local_e8.graph_id = 0;
        local_e8.pg = (ComputationGraph *)local_98;
      }
      else {
        local_98._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar4->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar9) + 0x20);
        puVar5 = *(undefined8 **)
                  ((long)&(pvVar4->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data + lVar9);
        local_98._16_8_ = *puVar5;
        local_98._24_8_ = puVar5[1];
        local_e8.i = 3;
        local_e8.graph_id = 0;
        local_e8.pg = (ComputationGraph *)local_98;
      }
      local_98._40_8_ = local_128._8_8_;
      local_98._32_8_ = local_128._0_8_;
      local_108 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                            ((initializer_list<dynet::Expression> *)&local_e8);
      local_108 = logistic(&local_108);
      local_e8 = operator-(1.0,&local_108);
      local_d8 = (Expression)ZEXT816(0);
      if (bVar12 || bVar11) {
        lVar6 = *(long *)((long)&(pvVar4->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_98._0_8_ = *(undefined8 *)(lVar6 + 0x50);
        local_98._8_8_ = *(undefined8 *)(lVar6 + 0x58);
        lVar6 = *(long *)((long)&(pvVar4->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_98._16_8_ = *(undefined8 *)(lVar6 + 0x30);
        local_98._24_8_ = *(undefined8 *)(lVar6 + 0x38);
        lVar6 = *(long *)((long)&(pvVar4->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_98._48_8_ = *(undefined8 *)(lVar6 + 0x40);
        local_98._56_8_ = *(undefined8 *)(lVar6 + 0x48);
        local_98._72_4_ = local_b8.i;
        local_98._76_4_ = local_b8.graph_id;
        local_98._64_8_ = local_b8.pg;
        local_138.i = 5;
        local_138.graph_id = 0;
      }
      else {
        lVar6 = *(long *)((long)&(pvVar4->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_98._0_8_ = *(undefined8 *)(lVar6 + 0x50);
        local_98._8_8_ = *(undefined8 *)(lVar6 + 0x58);
        lVar6 = *(long *)((long)&(pvVar4->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_98._16_8_ = *(undefined8 *)(lVar6 + 0x30);
        local_98._24_8_ = *(undefined8 *)(lVar6 + 0x38);
        local_138.i = 3;
        local_138.graph_id = 0;
      }
      local_138.pg = (ComputationGraph *)local_98;
      local_98._40_8_ = local_128._8_8_;
      local_98._32_8_ = local_128._0_8_;
      local_d8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                           ((initializer_list<dynet::Expression> *)&local_138);
      local_d8 = logistic(&local_d8);
      local_138 = (Expression)ZEXT816(0);
      if (bVar12 || bVar11) {
        local_98._64_16_ = (undefined1  [16])cmult(&local_d8,&local_b8);
        local_98._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar4->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar9) + 0x80);
        lVar6 = *(long *)((long)&(pvVar4->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_98._16_8_ = *(undefined8 *)(lVar6 + 0x60);
        local_98._24_8_ = *(undefined8 *)(lVar6 + 0x68);
        local_98._32_8_ = local_128._0_8_;
        local_98._40_8_ = local_128._8_8_;
        lVar6 = *(long *)((long)&(pvVar4->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_98._48_8_ = *(undefined8 *)(lVar6 + 0x70);
        local_98._56_8_ = *(undefined8 *)(lVar6 + 0x78);
        local_f8.i = 5;
        local_f8.graph_id = 0;
        local_f8.pg = (ComputationGraph *)local_98;
        local_138 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&local_f8);
        tanh((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        local_98._0_16_ = (undefined1  [16])cmult(&local_108,&local_138);
        local_f8 = cmult(&local_e8,&local_b8);
        EVar13 = operator+(&local_f8,(Expression *)local_98);
      }
      else {
        local_98._0_16_ =
             *(undefined1 (*) [16])
              (*(long *)((long)&(pvVar4->
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                )._M_impl.super__Vector_impl_data + lVar9) + 0x80);
        lVar6 = *(long *)((long)&(pvVar4->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_98._16_8_ = *(undefined8 *)(lVar6 + 0x60);
        local_98._24_8_ = *(undefined8 *)(lVar6 + 0x68);
        local_98._32_8_ = local_128._0_8_;
        local_98._40_8_ = local_128._8_8_;
        local_f8.i = 3;
        local_f8.graph_id = 0;
        local_f8.pg = (ComputationGraph *)local_98;
        local_138 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&local_f8);
        tanh((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        EVar13 = cmult(&local_108,&local_138);
      }
      pEVar2 = local_c0[-1].
               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(ComputationGraph **)((long)&pEVar2->pg + lVar8) = EVar13.pg;
      *(long *)((long)&pEVar2->i + lVar8) = EVar13._8_8_;
      local_128._0_16_ = *(undefined1 (*) [16])((long)&pEVar2->pg + lVar8);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x18;
      lVar8 = lVar8 + 0x10;
    } while (uVar10 < local_a0->layers);
  }
  fVar1 = (local_a0->super_RNNBuilder).dropout_rate;
  pEVar2 = local_c0[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    EVar13 = dropout(pEVar2 + -1,fVar1);
  }
  else {
    EVar13 = pEVar2[-1];
  }
  return EVar13;
}

Assistant:

Expression GRUBuilder::add_input_impl(int prev, const Expression& x) {
  //if(dropout_rate != 0.f)
  //throw std::runtime_error("GRUBuilder doesn't support dropout yet");
  const bool has_initial_state = (h0.size() > 0);
  h.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression h_tprev;
    // prev_zero means that h_tprev should be treated as 0
    bool prev_zero = false;
    if (prev >= 0 || has_initial_state) {
      h_tprev = (prev < 0) ? h0[i] : h[prev][i];
    } else { prev_zero = true; }
    if (dropout_rate) in = dropout(in, dropout_rate);
    // update gate
    Expression zt;
    if (prev_zero)
      zt = affine_transform({vars[BZ], vars[X2Z], in});
    else
      zt = affine_transform({vars[BZ], vars[X2Z], in, vars[H2Z], h_tprev});
    zt = logistic(zt);
    // forget
    Expression ft = 1.f - zt;
    // reset gate
    Expression rt;
    if (prev_zero)
      rt = affine_transform({vars[BR], vars[X2R], in});
    else
      rt = affine_transform({vars[BR], vars[X2R], in, vars[H2R], h_tprev});
    rt = logistic(rt);

    // candidate activation
    Expression ct;
    if (prev_zero) {
      ct = affine_transform({vars[BH], vars[X2H], in});
      ct = tanh(ct);
      Expression nwt = cmult(zt, ct);
      in = ht[i] = nwt;
    } else {
      Expression ght = cmult(rt, h_tprev);
      ct = affine_transform({vars[BH], vars[X2H], in, vars[H2H], ght});
      ct = tanh(ct);
      Expression nwt = cmult(zt, ct);
      Expression crt = cmult(ft, h_tprev);
      in = ht[i] = crt + nwt;
    }
  }
  if (dropout_rate) return dropout(ht.back(), dropout_rate);
  else return ht.back();
}